

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_resp(connectdata *conn,int imapcode,imapstate instate)

{
  saslprogress local_34;
  anon_union_240_10_26c073a1_for_proto *paStack_30;
  saslprogress progress;
  imap_conn *imapc;
  Curl_easy *data;
  imapstate local_18;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  imapc = (imap_conn *)conn->data;
  paStack_30 = &conn->proto;
  local_18 = instate;
  result = imapcode;
  _instate_local = conn;
  data._4_4_ = Curl_sasl_continue(&(conn->proto).imapc.sasl,conn,imapcode,&local_34);
  if (data._4_4_ == CURLE_OK) {
    if (local_34 == SASL_IDLE) {
      if ((((paStack_30->imapc).login_disabled & 1U) == 0) &&
         (((paStack_30->imapc).preftype & 1) != 0)) {
        data._4_4_ = imap_perform_login(_instate_local);
      }
      else {
        Curl_failf((Curl_easy *)imapc,"Authentication cancelled");
        data._4_4_ = CURLE_LOGIN_DENIED;
      }
    }
    else if (local_34 == SASL_DONE) {
      state(_instate_local,IMAP_STOP);
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_auth_resp(struct connectdata *conn,
                                     int imapcode,
                                     imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  saslprogress progress;

  (void)instate; /* no use for this yet */

  result = Curl_sasl_continue(&imapc->sasl, conn, imapcode, &progress);
  if(!result)
    switch(progress) {
    case SASL_DONE:
      state(conn, IMAP_STOP);  /* Authenticated */
      break;
    case SASL_IDLE:            /* No mechanism left after cancellation */
      if((!imapc->login_disabled) && (imapc->preftype & IMAP_TYPE_CLEARTEXT))
        /* Perform clear text authentication */
        result = imap_perform_login(conn);
      else {
        failf(data, "Authentication cancelled");
        result = CURLE_LOGIN_DENIED;
      }
      break;
    default:
      break;
    }

  return result;
}